

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O1

err_t btokBAuthTStepG(octet *key,void *state)

{
  bool_t bVar1;
  err_t eVar2;
  
  bVar1 = objIsOperable(state);
  eVar2 = 0x6d;
  if (bVar1 != 0) {
    bVar1 = memIsValid(key,0x20);
    if (bVar1 != 0) {
      memCopy(key,(void *)((long)state + 0x1d8),0x20);
      eVar2 = 0;
    }
  }
  return eVar2;
}

Assistant:

err_t btokBAuthTStepG(octet key[32], void* state)
{
	bake_bauth_t_o* s = (bake_bauth_t_o*)state;
	// проверить входные данные
	if (!objIsOperable(s) ||
		!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// key <- K0
	memCopy(key, s->K0, 32);
	// все нормально
	return ERR_OK;
}